

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_zeropage_x_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1eb03e::NopZeroXFixture_nop_zerox_Test::TestBody
          (NopZeroXFixture_nop_zerox_Test *this)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  ParamType *pPVar4;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar5;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar6;
  char *message;
  AssertHelper local_118;
  Message local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_e8;
  WithoutMatchers local_c1;
  Matcher<unsigned_short> local_c0;
  MockSpec<unsigned_char_(unsigned_short)> local_a8;
  ReturnAction<int> local_88;
  Action<unsigned_char_(unsigned_short)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  NopZeroXFixture_nop_zerox_Test *local_10;
  NopZeroXFixture_nop_zerox_Test *this_local;
  
  local_10 = this;
  pPVar4 = testing::WithParamInterface<unsigned_char>::GetParam();
  n_e_s::core::test::CpuTest::stage_instruction((CpuTest *)this,*pPVar4);
  (this->super_NopZeroXFixture).super_CpuTest.registers.x = '\x01';
  (this->super_NopZeroXFixture).super_CpuTest.expected.x = '\x01';
  uVar1 = (this->super_NopZeroXFixture).super_CpuTest.expected.pc;
  if (SCARRY4((uint)uVar1,1)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  (this->super_NopZeroXFixture).super_CpuTest.expected.pc = uVar1 + 1;
  uVar1 = (this->super_NopZeroXFixture).super_CpuTest.registers.pc;
  if (!SCARRY4((uint)uVar1,1)) {
    testing::Matcher<unsigned_short>::Matcher(&local_48,uVar1 + 1);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_30,&(this->super_NopZeroXFixture).super_CpuTest.mmu.super_MockMmu,&local_48);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_30,local_55,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_nop_zeropage_x_instructions.cpp"
                        ,0x13,"mmu","read_byte(registers.pc + 1)");
    testing::Return<int>((testing *)&local_88,0xcd);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_78,(ReturnAction *)&local_88);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_78);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_78);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_88);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
    testing::Matcher<unsigned_short>::~Matcher(&local_48);
    testing::Matcher<unsigned_short>::Matcher(&local_c0,0xcd);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_a8,&(this->super_NopZeroXFixture).super_CpuTest.mmu.super_MockMmu,&local_c0);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_a8,&local_c1,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_nop_zeropage_x_instructions.cpp"
                        ,0x14,"mmu","read_byte(0xCD)");
    testing::Return<int>((testing *)&gtest_ar.message_,0xfd);
    testing::internal::ReturnAction::operator_cast_to_Action
              (&local_e8,(ReturnAction *)&gtest_ar.message_);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_e8);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_e8);
    testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)&gtest_ar.message_);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_a8);
    testing::Matcher<unsigned_short>::~Matcher(&local_c0);
    n_e_s::core::test::CpuTest::step_execution((CpuTest *)this,'\x04');
    testing::internal::EqHelper::
    Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
              ((EqHelper *)local_108,"expected","registers",
               &(this->super_NopZeroXFixture).super_CpuTest.expected,
               &(this->super_NopZeroXFixture).super_CpuTest.registers);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar3) {
      testing::Message::Message(&local_110);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_nop_zeropage_x_instructions.cpp"
                 ,0x17,message);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

TEST_P(NopZeroXFixture, nop_zerox) {
    stage_instruction(GetParam());
    expected.x = registers.x = 0x01;
    expected.pc += 1;
    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0xCD));
    EXPECT_CALL(mmu, read_byte(0xCD)).WillOnce(Return(0xFD)); // Dummy read

    step_execution(4);
    EXPECT_EQ(expected, registers);
}